

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O0

void __thiscall
cmTargetPropCommandBase::HandleInterfaceContent
          (cmTargetPropCommandBase *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool param_4)

{
  char *pcVar1;
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  byte local_10b;
  byte local_10a;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string totalContent;
  char *propValue;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string propName;
  bool param_4_local;
  bool prepend_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  cmTargetPropCommandBase *this_local;
  
  propName.field_2._M_local_buf[0xe] = param_4;
  propName.field_2._M_local_buf[0xf] = prepend;
  if (prepend) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"INTERFACE_",&local_69);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,&this->Property);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    totalContent.field_2._8_8_ = cmTarget::GetProperty(tgt,(string *)local_48);
    (*(this->super_cmCommand)._vptr_cmCommand[10])(&local_c8,this,content);
    local_10a = 0;
    local_10b = 0;
    if (totalContent.field_2._8_8_ == 0) {
      std::__cxx11::string::string((string *)&local_e8);
    }
    else {
      std::allocator<char>::allocator();
      local_10a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,";",&local_109);
      local_10b = 1;
      std::operator+(&local_e8,&local_108,(char *)totalContent.field_2._8_8_);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   &local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    if ((local_10b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_108);
    }
    if ((local_10a & 1) != 0) {
      std::allocator<char>::~allocator(&local_109);
    }
    std::__cxx11::string::~string((string *)&local_c8);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    cmTarget::SetProperty(tgt,(string *)local_48,pcVar1);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    std::operator+(&local_130,"INTERFACE_",&this->Property);
    (*(this->super_cmCommand)._vptr_cmCommand[10])(local_150,this,content);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    cmTarget::AppendProperty(tgt,&local_130,pcVar1,false);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string((string *)&local_130);
  }
  return;
}

Assistant:

void cmTargetPropCommandBase::HandleInterfaceContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend, bool)
{
  if (prepend) {
    const std::string propName = std::string("INTERFACE_") + this->Property;
    const char* propValue = tgt->GetProperty(propName);
    const std::string totalContent = this->Join(content) +
      (propValue ? std::string(";") + propValue : std::string());
    tgt->SetProperty(propName, totalContent.c_str());
  } else {
    tgt->AppendProperty("INTERFACE_" + this->Property,
                        this->Join(content).c_str());
  }
}